

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

Bit32u __thiscall MT32Emu::Synth::getPartStates(Synth *this)

{
  int local_2c;
  uint local_28;
  int partNumber;
  Bit32u bitSet;
  bool partStates [9];
  Synth *this_local;
  
  if ((this->opened & 1U) == 0) {
    this_local._4_4_ = 0;
  }
  else {
    partStates._1_8_ = this;
    getPartStates(this,(bool *)((long)&partNumber + 3));
    local_28 = 0;
    for (local_2c = 8; -1 < local_2c; local_2c = local_2c + -1) {
      local_28 = local_28 << 1 |
                 (uint)((*(byte *)((long)&partNumber + (long)local_2c + 3) & 1) != 0);
    }
    this_local._4_4_ = local_28;
  }
  return this_local._4_4_;
}

Assistant:

Bit32u Synth::getPartStates() const {
	if (!opened) return 0;
	bool partStates[9];
	getPartStates(partStates);
	Bit32u bitSet = 0;
	for (int partNumber = 8; partNumber >= 0; partNumber--) {
		bitSet = (bitSet << 1) | (partStates[partNumber] ? 1 : 0);
	}
	return bitSet;
}